

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_ps.c
# Opt level: O3

MPP_RET avs2d_parse_sequence_header(Avs2dCtx_t *p_dec)

{
  BitReadCtx_t *bitctx;
  Avs2dSeqHeader_t *vsh;
  RK_U32 *pRVar1;
  byte bVar2;
  RK_U8 RVar3;
  byte bVar4;
  MPP_RET MVar5;
  MPP_RET MVar6;
  undefined8 in_RAX;
  char *fmt;
  ulong uVar7;
  Avs2dRps_t *rps;
  undefined8 uStack_38;
  RK_S32 _out;
  
  bitctx = &p_dec->bitctx;
  vsh = &p_dec->vsh;
  uStack_38 = in_RAX;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","Bitread buf %p, data %p, buf_len %d, left %d\n",
               "avs2d_parse_sequence_header",(p_dec->bitctx).buf,(p_dec->bitctx).data_,
               (ulong)(uint)(p_dec->bitctx).buf_len,(ulong)(p_dec->bitctx).bytes_left_);
  }
  memset(vsh,0,0x530);
  MVar5 = mpp_read_bits(bitctx,8,&_out);
  (p_dec->bitctx).ret = MVar5;
  if (MVar5 != MPP_OK) {
    return MVar5;
  }
  uVar7 = (ulong)(_out & 0xff);
  bVar2 = (byte)((ulong)uStack_38 >> 0x20);
  vsh->profile_id = bVar2;
  if ((bVar2 < 0x23) && ((0x500040000U >> (uVar7 & 0x3f) & 1) != 0)) {
    MVar5 = mpp_read_bits(bitctx,8,&_out);
    (p_dec->bitctx).ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    bVar2 = (byte)((ulong)uStack_38 >> 0x20);
    (p_dec->vsh).level_id = bVar2;
    if (bVar2 < 0x6b) {
      MVar5 = mpp_read_bits(bitctx,1,&_out);
      (p_dec->bitctx).ret = MVar5;
      if (MVar5 != MPP_OK) {
        return MVar5;
      }
      (p_dec->vsh).progressive_sequence = (byte)_out;
      MVar5 = mpp_read_bits(bitctx,1,&_out);
      (p_dec->bitctx).ret = MVar5;
      if (MVar5 != MPP_OK) {
        return MVar5;
      }
      (p_dec->vsh).field_coded_sequence = (byte)_out;
      MVar5 = mpp_read_bits(bitctx,0xe,&_out);
      (p_dec->bitctx).ret = MVar5;
      if (MVar5 != MPP_OK) {
        return MVar5;
      }
      (p_dec->vsh).horizontal_size = _out;
      MVar5 = mpp_read_bits(bitctx,0xe,&_out);
      (p_dec->bitctx).ret = MVar5;
      if (MVar5 != MPP_OK) {
        return MVar5;
      }
      (p_dec->vsh).vertical_size = _out;
      if ((uint)_out < 0x10 || (p_dec->vsh).horizontal_size < 0x10) {
        _mpp_log_l(2,"avs2d_ps","invalid sequence width(%d), height(%d).\n",
                   "avs2d_parse_sequence_header");
        return MPP_NOK;
      }
      MVar5 = mpp_read_bits(bitctx,2,&_out);
      (p_dec->bitctx).ret = MVar5;
      if (MVar5 != MPP_OK) {
        return MVar5;
      }
      RVar3 = (RK_U8)((ulong)uStack_38 >> 0x20);
      (p_dec->vsh).chroma_format = RVar3;
      if (RVar3 == '\x01') {
        MVar5 = mpp_read_bits(bitctx,3,&_out);
        (p_dec->bitctx).ret = MVar5;
        if (MVar5 != MPP_OK) {
          return MVar5;
        }
        (p_dec->vsh).sample_precision = (byte)_out;
        if ((p_dec->vsh).profile_id == '\"') {
          MVar5 = mpp_read_bits(bitctx,3,&_out);
          (p_dec->bitctx).ret = MVar5;
          if (MVar5 != MPP_OK) {
            return MVar5;
          }
          (p_dec->vsh).encoding_precision = (byte)_out;
          bVar2 = (p_dec->vsh).sample_precision;
          bVar4 = (byte)_out;
        }
        else {
          (p_dec->vsh).encoding_precision = '\x01';
          bVar4 = 1;
          bVar2 = (byte)_out;
        }
        (p_dec->vsh).bit_depth = bVar4 * '\x02' + '\x06';
        if ((byte)(bVar2 - 3) < 0xfe) {
          uVar7 = (ulong)bVar2;
          fmt = "sample_precision 0x%02x is not supported.\n";
        }
        else if ((byte)(bVar4 - 3) < 0xfe) {
          uVar7 = (ulong)bVar4;
          fmt = "encoding_precision 0x%02x is not supported.\n";
        }
        else {
          MVar5 = mpp_read_bits(bitctx,4,&_out);
          (p_dec->bitctx).ret = MVar5;
          if (MVar5 != MPP_OK) {
            return MVar5;
          }
          (p_dec->vsh).aspect_ratio = (byte)_out;
          MVar5 = mpp_read_bits(bitctx,4,&_out);
          (p_dec->bitctx).ret = MVar5;
          if (MVar5 != MPP_OK) {
            return MVar5;
          }
          (p_dec->vsh).frame_rate_code = (byte)_out;
          MVar5 = mpp_read_bits(bitctx,0x12,&_out);
          (p_dec->bitctx).ret = MVar5;
          if (MVar5 != MPP_OK) {
            return MVar5;
          }
          (p_dec->vsh).bit_rate = _out << 0xc;
          MVar5 = mpp_read_bits(bitctx,1,&_out);
          (p_dec->bitctx).ret = MVar5;
          if ((MVar5 == MPP_OK) && ((byte)_out != '\x01')) {
            if (((byte)avs2d_parse_debug & 4) != 0) {
              _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,
                         0x157);
            }
          }
          else if (MVar5 != MPP_OK) {
            return MVar5;
          }
          MVar5 = mpp_read_bits(bitctx,0xc,&_out);
          (p_dec->bitctx).ret = MVar5;
          if (MVar5 != MPP_OK) {
            return MVar5;
          }
          pRVar1 = &(p_dec->vsh).bit_rate;
          *pRVar1 = *pRVar1 + _out;
          MVar5 = mpp_read_bits(bitctx,1,&_out);
          (p_dec->bitctx).ret = MVar5;
          if (MVar5 != MPP_OK) {
            return MVar5;
          }
          (p_dec->vsh).low_delay = (byte)_out;
          MVar5 = mpp_read_bits(bitctx,1,&_out);
          (p_dec->bitctx).ret = MVar5;
          if ((MVar5 == MPP_OK) && ((byte)_out != '\x01')) {
            if (((byte)avs2d_parse_debug & 4) != 0) {
              _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,
                         0x15b);
            }
          }
          else if (MVar5 != MPP_OK) {
            return MVar5;
          }
          MVar5 = mpp_read_bits(bitctx,1,&_out);
          (p_dec->bitctx).ret = MVar5;
          if (MVar5 != MPP_OK) {
            return MVar5;
          }
          (p_dec->vsh).enable_temporal_id = (byte)_out;
          MVar5 = mpp_read_bits(bitctx,0x12,&_out);
          (p_dec->bitctx).ret = MVar5;
          if (MVar5 != MPP_OK) {
            return MVar5;
          }
          (p_dec->vsh).bbv_buffer_size = _out;
          MVar5 = mpp_read_bits(bitctx,3,&_out);
          (p_dec->bitctx).ret = MVar5;
          if (MVar5 != MPP_OK) {
            return MVar5;
          }
          RVar3 = (RK_U8)((ulong)uStack_38 >> 0x20);
          (p_dec->vsh).lcu_size = RVar3;
          if (0xfc < (byte)(RVar3 - 7)) {
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_weighted_quant = (byte)_out;
            if ((byte)_out != '\0') {
              parse_sequence_wqm(bitctx,vsh);
            }
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_background_picture = (byte)((ulong)uStack_38 >> 0x20) ^ 1;
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_mhp_skip = (byte)_out;
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_dhp = (byte)_out;
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_wsm = (byte)_out;
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_amp = (byte)_out;
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_nsqt = (byte)_out;
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_nsip = (byte)_out;
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_2nd_transform = (byte)_out;
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_sao = (byte)_out;
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_alf = (byte)_out;
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            (p_dec->vsh).enable_pmvr = (byte)_out;
            MVar5 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar5;
            if ((MVar5 == MPP_OK) && ((byte)_out != '\x01')) {
              if (((byte)avs2d_parse_debug & 4) != 0) {
                _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,
                           0x176);
              }
            }
            else if (MVar5 != MPP_OK) {
              return MVar5;
            }
            MVar5 = mpp_read_bits(bitctx,6,&_out);
            (p_dec->bitctx).ret = MVar5;
            if (MVar5 != MPP_OK) {
              return MVar5;
            }
            RVar3 = (RK_U8)((ulong)uStack_38 >> 0x20);
            (p_dec->vsh).num_of_rps = RVar3;
            if (RVar3 == '\0') {
              MVar5 = MPP_OK;
            }
            else {
              rps = (p_dec->vsh).seq_rps;
              uVar7 = 0;
              do {
                if (((byte)avs2d_parse_debug & 8) != 0) {
                  _mpp_log_l(4,"avs2d_ps","--------rcs[%d]--------","avs2d_parse_sequence_header",
                             uVar7 & 0xffffffff);
                }
                MVar5 = parse_one_rps(bitctx,rps);
                if (MVar5 < MPP_OK) {
                  if (((byte)avs2d_parse_debug & 4) != 0) {
                    _mpp_log_l(4,"avs2d_ps","Function error(%d).\n",(char *)0x0,0x17d);
                    return MVar5;
                  }
                  return MVar5;
                }
                uVar7 = uVar7 + 1;
                rps = rps + 1;
              } while (uVar7 < (p_dec->vsh).num_of_rps);
            }
            if ((p_dec->vsh).low_delay == '\0') {
              MVar6 = mpp_read_bits(bitctx,5,&_out);
              (p_dec->bitctx).ret = MVar6;
              if (MVar6 != MPP_OK) {
                return MVar6;
              }
              (p_dec->vsh).picture_reorder_delay = (byte)_out;
            }
            else {
              (p_dec->vsh).picture_reorder_delay = '\0';
            }
            MVar6 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar6;
            if (MVar6 == MPP_OK) {
              (p_dec->vsh).enable_clf = (byte)_out;
              MVar6 = mpp_read_bits(bitctx,2,&_out);
              (p_dec->bitctx).ret = MVar6;
              if (MVar6 != MPP_OK) {
                return MVar6;
              }
              if (_out != 0) {
                if (((byte)avs2d_parse_debug & 4) != 0) {
                  _mpp_log_l(4,"avs2d_ps","reserver bits error.\n",(char *)0x0);
                  return MVar5;
                }
                return MVar5;
              }
              return MVar5;
            }
            return MVar6;
          }
          uVar7 = (ulong)(_out & 0xff);
          fmt = "invalid lcu size: %d\n";
        }
      }
      else {
        uVar7 = (ulong)(_out & 0xff);
        fmt = "chroma_format 0x%02x is not supported.\n";
      }
    }
    else {
      uVar7 = (ulong)(_out & 0xff);
      fmt = "level_id 0x%02x is not supported.\n";
    }
  }
  else {
    fmt = "profile_id 0x%02x is not supported.\n";
  }
  _mpp_log_l(2,"avs2d_ps",fmt,"avs2d_parse_sequence_header",uVar7);
  return MPP_NOK;
}

Assistant:

MPP_RET avs2d_parse_sequence_header(Avs2dCtx_t *p_dec)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i;
    RK_U32 val_temp = 0;
    Avs2dRps_t *rps = NULL;
    BitReadCtx_t *bitctx = &p_dec->bitctx;
    Avs2dSeqHeader_t *vsh = &p_dec->vsh;

    AVS2D_PARSE_TRACE("Bitread buf %p, data %p, buf_len %d, left %d\n", bitctx->buf, bitctx->data_, bitctx->buf_len, bitctx->bytes_left_);
    memset(vsh, 0, sizeof(Avs2dSeqHeader_t));
    READ_BITS(bitctx, 8, &vsh->profile_id);
    //!< check profile_id
    if (vsh->profile_id != 0x12 && vsh->profile_id != 0x20 && vsh->profile_id != 0x22) {
        ret = MPP_NOK;
        mpp_err_f("profile_id 0x%02x is not supported.\n", vsh->profile_id);
        goto __FAILED;
    }
    READ_BITS(bitctx, 8, &vsh->level_id);
    if (vsh->level_id > 0x6A) {
        ret = MPP_NOK;
        mpp_err_f("level_id 0x%02x is not supported.\n", vsh->level_id);
        goto __FAILED;
    }
    READ_ONEBIT(bitctx, &vsh->progressive_sequence);
    READ_ONEBIT(bitctx, &vsh->field_coded_sequence);
    READ_BITS(bitctx, 14, &vsh->horizontal_size);
    READ_BITS(bitctx, 14, &vsh->vertical_size);
    if (vsh->horizontal_size < 16 || vsh->vertical_size < 16) {
        ret = MPP_NOK;
        mpp_err_f("invalid sequence width(%d), height(%d).\n",
                  vsh->horizontal_size, vsh->vertical_size);
        goto __FAILED;
    }

    READ_BITS(bitctx, 2,  &vsh->chroma_format);
    if (vsh->chroma_format != CHROMA_420) {
        ret = MPP_NOK;
        mpp_err_f("chroma_format 0x%02x is not supported.\n", vsh->chroma_format);
        goto __FAILED;
    }
    READ_BITS(bitctx, 3, &vsh->sample_precision);
    if (vsh->profile_id == MAIN10_PROFILE) {
        READ_BITS(bitctx, 3, &vsh->encoding_precision);
    } else {
        vsh->encoding_precision = 1;
    }
    vsh->bit_depth = 6 + (vsh->encoding_precision << 1);

    if (vsh->sample_precision < 1 || vsh->sample_precision > 2) {
        ret = MPP_NOK;
        mpp_err_f("sample_precision 0x%02x is not supported.\n", vsh->sample_precision);
        goto __FAILED;
    }
    if (vsh->encoding_precision < 1 || vsh->encoding_precision > 2) {
        ret = MPP_NOK;
        mpp_err_f("encoding_precision 0x%02x is not supported.\n", vsh->encoding_precision);
        goto __FAILED;
    }

    READ_BITS(bitctx, 4, &vsh->aspect_ratio);
    READ_BITS(bitctx, 4, &vsh->frame_rate_code);
    READ_BITS(bitctx, 18, &val_temp); //!< bit_rate_lower_18
    vsh->bit_rate = val_temp << 12;
    READ_MARKER_BIT(bitctx);
    READ_BITS(bitctx, 12, &val_temp); //!< bit_rate_upper_12
    vsh->bit_rate += val_temp;
    READ_ONEBIT(bitctx, &vsh->low_delay);
    READ_MARKER_BIT(bitctx);
    READ_ONEBIT(bitctx, &vsh->enable_temporal_id);
    READ_BITS(bitctx, 18, &vsh->bbv_buffer_size);
    READ_BITS(bitctx, 3, &vsh->lcu_size);
    if (vsh->lcu_size < 4 || vsh->lcu_size > 6) {
        ret = MPP_NOK;
        mpp_err_f("invalid lcu size: %d\n", vsh->lcu_size);
        goto __FAILED;
    }

    READ_ONEBIT(bitctx, &vsh->enable_weighted_quant);
    if (vsh->enable_weighted_quant) {
        parse_sequence_wqm(bitctx, vsh);
    }

    READ_ONEBIT(bitctx, &val_temp);
    vsh->enable_background_picture = val_temp ^ 0x01;
    READ_ONEBIT(bitctx, &vsh->enable_mhp_skip);
    READ_ONEBIT(bitctx, &vsh->enable_dhp);
    READ_ONEBIT(bitctx, &vsh->enable_wsm);
    READ_ONEBIT(bitctx, &vsh->enable_amp);
    READ_ONEBIT(bitctx, &vsh->enable_nsqt);
    READ_ONEBIT(bitctx, &vsh->enable_nsip);
    READ_ONEBIT(bitctx, &vsh->enable_2nd_transform);
    READ_ONEBIT(bitctx, &vsh->enable_sao);
    READ_ONEBIT(bitctx, &vsh->enable_alf);
    READ_ONEBIT(bitctx, &vsh->enable_pmvr);
    READ_MARKER_BIT(bitctx);

    //!< parse rps
    READ_BITS(bitctx, 6, &vsh->num_of_rps);
    for (i = 0; i < vsh->num_of_rps; i++) {
        rps = &vsh->seq_rps[i];
        AVS2D_PARSE_TRACE("--------rcs[%d]--------", i);
        FUN_CHECK(ret = parse_one_rps(bitctx, rps));
    }

    if (vsh->low_delay == 0) {
        READ_BITS(bitctx, 5, &vsh->picture_reorder_delay);
    } else {
        vsh->picture_reorder_delay = 0;
    }
    READ_ONEBIT(bitctx, &vsh->enable_clf);
    READ_BITS(bitctx, 2, &val_temp); //!< reserved 2bits 00
    if (val_temp) {
        AVS2D_DBG(AVS2D_DBG_WARNNING, "reserver bits error.\n");
    }
    return ret;
__BITREAD_ERR:
    return ret = bitctx->ret;
__FAILED:
    return ret;
}